

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-copyfile.c
# Opt level: O1

int run_test_fs_copyfile(void)

{
  long lVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  undefined8 uVar5;
  undefined1 *puVar6;
  char **ppcVar7;
  char **ppcVar8;
  long *plVar9;
  char *unaff_R12;
  undefined1 *puVar10;
  char *unaff_R15;
  code *name;
  char *pcVar11;
  int64_t eval_b;
  int64_t eval_a;
  char src [14];
  uv_fs_t req;
  long alStack_600 [15];
  long lStack_588;
  long lStack_558;
  undefined1 *puStack_440;
  char *pcStack_438;
  undefined1 *puStack_430;
  code *pcStack_428;
  undefined8 uStack_420;
  long alStack_418 [2];
  undefined1 auStack_408 [16];
  undefined1 auStack_3f8 [88];
  uint uStack_3a0;
  undefined8 uStack_238;
  char *pcStack_230;
  char *local_200;
  char *local_1f8;
  undefined6 local_1f0;
  undefined2 uStack_1ea;
  undefined6 uStack_1e8;
  uv_fs_t local_1e0;
  
  uStack_1e8 = 0x6372735f65;
  local_1f0 = 0x665f74736574;
  uStack_1ea = 0x6c69;
  uVar5 = uv_default_loop();
  iVar3 = uv_fs_copyfile(0,&local_1e0,&local_1f0,"test_file_dst",0xffffffff,0);
  local_1f8 = (char *)(long)iVar3;
  local_200 = (char *)0xffffffffffffffea;
  if (local_1f8 == (char *)0xffffffffffffffea) {
    uv_fs_req_cleanup(&local_1e0);
    unaff_R15 = (char *)&local_1f0;
    unlink(unaff_R15);
    unaff_R12 = "test_file_dst";
    unlink("test_file_dst");
    iVar3 = uv_fs_copyfile(0,&local_1e0,unaff_R15,"test_file_dst",0,0);
    local_1f8 = (char *)local_1e0.result;
    local_200 = (char *)0xfffffffffffffffe;
    if ((char *)local_1e0.result != (char *)0xfffffffffffffffe) goto LAB_001872a0;
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0xfffffffffffffffe;
    if (local_1f8 != (char *)0xfffffffffffffffe) goto LAB_001872af;
    uv_fs_req_cleanup(&local_1e0);
    iVar3 = uv_fs_stat(0,&local_1e0,"test_file_dst",0);
    if (iVar3 == 0) goto LAB_001872be;
    uv_fs_req_cleanup(&local_1e0);
    unaff_R15 = (char *)&local_1f0;
    touch_file(unaff_R15,0xc);
    iVar3 = uv_fs_copyfile(0,&local_1e0,unaff_R15,unaff_R15,0,0);
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0x0;
    if (local_1f8 != (char *)0x0) goto LAB_001872c3;
    uv_fs_req_cleanup(&local_1e0);
    iVar3 = uv_fs_stat(0,&local_1e0,&local_1f0,0);
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0x0;
    if (local_1f8 != (char *)0x0) goto LAB_001872d2;
    local_1f8 = (char *)0xc;
    local_200 = (char *)local_1e0.statbuf.st_size;
    if ((char *)local_1e0.statbuf.st_size != (char *)0xc) goto LAB_001872e1;
    uv_fs_req_cleanup(&local_1e0);
    unlink((char *)&local_1f0);
    unaff_R15 = "test_file_dst";
    unlink("test_file_dst");
    iVar3 = uv_fs_copyfile(0,&local_1e0,"test/fixtures/load_error.node","test_file_dst",0,0);
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0x0;
    if (local_1f8 != (char *)0x0) goto LAB_001872f0;
    handle_result(&local_1e0);
    unaff_R15 = "test_file_dst";
    unlink("test_file_dst");
    unaff_R12 = (char *)&local_1f0;
    touch_file(unaff_R12,0);
    iVar3 = uv_fs_copyfile(0,&local_1e0,unaff_R12,"test_file_dst",0,0);
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0x0;
    if (local_1f8 != (char *)0x0) goto LAB_001872ff;
    handle_result(&local_1e0);
    iVar3 = uv_fs_copyfile(0,&local_1e0,"test/fixtures/load_error.node","test_file_dst",0,0);
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0x0;
    if (local_1f8 != (char *)0x0) goto LAB_0018730e;
    handle_result(&local_1e0);
    iVar3 = uv_fs_chmod(0,&local_1e0,"test_file_dst",0x1a4,0);
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0x0;
    if (local_1f8 != (char *)0x0) goto LAB_0018731d;
    uv_fs_req_cleanup(&local_1e0);
    iVar3 = uv_fs_copyfile(0,&local_1e0,"test/fixtures/load_error.node","test_file_dst",1,0);
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0xffffffffffffffef;
    if (local_1f8 != (char *)0xffffffffffffffef) goto LAB_0018732c;
    uv_fs_req_cleanup(&local_1e0);
    iVar3 = uv_fs_chmod(0,&local_1e0,"test_file_dst",0x1a4,0);
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0x0;
    name = (code *)unaff_R15;
    if (local_1f8 != (char *)0x0) goto LAB_0018733b;
    uv_fs_req_cleanup(&local_1e0);
    name = (code *)&local_1f0;
    touch_file((char *)name,1);
    iVar3 = uv_fs_copyfile(0,&local_1e0,name,"test_file_dst",0,0);
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0x0;
    if (local_1f8 != (char *)0x0) goto LAB_0018734a;
    handle_result(&local_1e0);
    unlink("test_file_dst");
    unaff_R12 = (char *)&local_1f0;
    touch_file(unaff_R12,0x2000);
    iVar3 = uv_fs_copyfile(0,&local_1e0,unaff_R12,"test_file_dst",0,0);
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0x0;
    name = (code *)"test_file_dst";
    if (local_1f8 != (char *)0x0) goto LAB_00187359;
    handle_result(&local_1e0);
    name = handle_result;
    unlink((char *)&local_1f0);
    unaff_R12 = "test_file_dst";
    unlink("test_file_dst");
    iVar3 = uv_fs_copyfile(uVar5,&local_1e0,"test/fixtures/load_error.node","test_file_dst",0,
                           handle_result);
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0x0;
    if (local_1f8 != (char *)0x0) goto LAB_00187368;
    local_1f8 = (char *)0x5;
    local_200 = (char *)(long)result_check_count;
    if (local_200 != (char *)0x5) goto LAB_00187377;
    uv_run(uVar5,0);
    local_1f8 = (char *)0x6;
    local_200 = (char *)(long)result_check_count;
    if (local_200 != (char *)0x6) goto LAB_00187386;
    iVar3 = uv_fs_chmod(0,&local_1e0,"test_file_dst",0x1a4,0);
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0x0;
    pcVar11 = (char *)name;
    if (local_1f8 != (char *)0x0) goto LAB_00187395;
    uv_fs_req_cleanup(&local_1e0);
    pcVar11 = "test_file_dst";
    unlink("test_file_dst");
    iVar3 = uv_fs_copyfile(uVar5,&local_1e0,"test/fixtures/load_error.node","test_file_dst",
                           0xffffffff,fail_cb);
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0xffffffffffffffea;
    if (local_1f8 != (char *)0xffffffffffffffea) goto LAB_001873a4;
    uv_run(uVar5,0);
    unlink("test_file_dst");
    iVar3 = uv_fs_copyfile(0,&local_1e0,"test/fixtures/load_error.node","test_file_dst",2,0);
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0x0;
    if (local_1f8 != (char *)0x0) goto LAB_001873b3;
    handle_result(&local_1e0);
    pcVar11 = "test_file_dst";
    unlink("test_file_dst");
    iVar3 = uv_fs_copyfile(0,&local_1e0,"test/fixtures/load_error.node","test_file_dst",4,0);
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0x0;
    if (0 < (long)local_1f8) goto LAB_001873c2;
    if (iVar3 == 0) {
      handle_result(&local_1e0);
    }
    unlink("test_file_dst");
    touch_file("test_file_dst",0);
    chmod("test_file_dst",0x124);
    pcVar11 = (char *)&local_1e0;
    iVar3 = uv_fs_copyfile(0,pcVar11,"test/fixtures/load_error.node","test_file_dst",0,0);
    local_1f8 = (char *)local_1e0.result;
    local_200 = (char *)0xfffffffffffffff3;
    if ((char *)local_1e0.result != (char *)0xfffffffffffffff3) goto LAB_001873d1;
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0xfffffffffffffff3;
    if (local_1f8 != (char *)0xfffffffffffffff3) goto LAB_001873e0;
    uv_fs_req_cleanup(&local_1e0);
    unlink("test_file_dst");
    uv_walk(uVar5,close_walk_cb,0);
    uv_run(uVar5,0);
    local_1f8 = (char *)0x0;
    iVar3 = uv_loop_close(uVar5);
    local_200 = (char *)(long)iVar3;
    if (local_1f8 == local_200) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_fs_copyfile_cold_1();
LAB_001872a0:
    run_test_fs_copyfile_cold_2();
LAB_001872af:
    run_test_fs_copyfile_cold_3();
LAB_001872be:
    run_test_fs_copyfile_cold_25();
LAB_001872c3:
    run_test_fs_copyfile_cold_4();
LAB_001872d2:
    run_test_fs_copyfile_cold_5();
LAB_001872e1:
    run_test_fs_copyfile_cold_6();
LAB_001872f0:
    run_test_fs_copyfile_cold_7();
LAB_001872ff:
    run_test_fs_copyfile_cold_8();
LAB_0018730e:
    run_test_fs_copyfile_cold_9();
LAB_0018731d:
    run_test_fs_copyfile_cold_10();
LAB_0018732c:
    run_test_fs_copyfile_cold_11();
    name = (code *)unaff_R15;
LAB_0018733b:
    run_test_fs_copyfile_cold_12();
LAB_0018734a:
    run_test_fs_copyfile_cold_13();
LAB_00187359:
    run_test_fs_copyfile_cold_14();
LAB_00187368:
    run_test_fs_copyfile_cold_15();
LAB_00187377:
    run_test_fs_copyfile_cold_16();
LAB_00187386:
    run_test_fs_copyfile_cold_17();
    pcVar11 = (char *)name;
LAB_00187395:
    run_test_fs_copyfile_cold_18();
LAB_001873a4:
    run_test_fs_copyfile_cold_19();
LAB_001873b3:
    run_test_fs_copyfile_cold_20();
LAB_001873c2:
    run_test_fs_copyfile_cold_24();
LAB_001873d1:
    run_test_fs_copyfile_cold_21();
LAB_001873e0:
    run_test_fs_copyfile_cold_22();
  }
  ppcVar8 = &local_1f8;
  ppcVar7 = &local_200;
  run_test_fs_copyfile_cold_23();
  puVar6 = auStack_3f8;
  pcStack_428 = (code *)0x187431;
  uStack_238 = uVar5;
  pcStack_230 = unaff_R12;
  uVar4 = uv_fs_open(0,puVar6,ppcVar8,0x241,0x180,0);
  puVar10 = (undefined1 *)(ulong)uVar4;
  pcStack_428 = (code *)0x18743c;
  uv_fs_req_cleanup(puVar6);
  auStack_408._0_8_ = SEXT48((int)uVar4);
  alStack_418[0] = 0;
  if (auStack_408._0_8_ == 0) {
    puVar6 = (undefined1 *)(ulong)uStack_3a0;
    pcStack_428 = (code *)0x187475;
    auStack_408 = uv_buf_init("a",1);
    if ((int)ppcVar7 != 0) {
      pcVar11 = (char *)0x0;
      puVar10 = auStack_3f8;
      unaff_R12 = (char *)0x0;
      do {
        uStack_420 = 0;
        pcStack_428 = (code *)0x1874af;
        iVar3 = uv_fs_write(0,puVar10,puVar6,auStack_408,1,unaff_R12);
        pcStack_428 = (code *)0x1874b9;
        uv_fs_req_cleanup();
        alStack_418[0] = (long)iVar3;
        alStack_418[1] = 0;
        if (alStack_418[0] < 0) {
          pcStack_428 = (code *)0x187535;
          touch_file_cold_2();
          goto LAB_00187535;
        }
        unaff_R12 = unaff_R12 + 1;
      } while ((char *)((ulong)ppcVar7 & 0xffffffff) != unaff_R12);
    }
    puVar10 = auStack_3f8;
    pcStack_428 = (code *)0x1874ed;
    uVar4 = uv_fs_close(0,puVar10,puVar6,0);
    puVar6 = (undefined1 *)(ulong)uVar4;
    pcStack_428 = (code *)0x1874f7;
    uv_fs_req_cleanup(puVar10);
    alStack_418[0] = (long)(int)uVar4;
    alStack_418[1] = 0;
    if (alStack_418[0] == 0) {
      return uVar4;
    }
  }
  else {
LAB_00187535:
    pcStack_428 = (code *)0x187544;
    touch_file_cold_1();
  }
  plVar9 = alStack_418;
  pcStack_428 = handle_result;
  touch_file_cold_3();
  alStack_600[0] = (long)(int)plVar9[9];
  puStack_440 = puVar6;
  pcStack_438 = unaff_R12;
  puStack_430 = puVar10;
  pcStack_428 = (code *)pcVar11;
  if (alStack_600[0] == 0x1e) {
    alStack_600[0] = plVar9[0xb];
    if (alStack_600[0] != 0) goto LAB_0018769b;
    iVar3 = uv_fs_stat(0,alStack_600,plVar9[0xd],0);
    lVar2 = lStack_558;
    lVar1 = lStack_588;
    if (iVar3 != 0) goto LAB_001876aa;
    uv_fs_req_cleanup(alStack_600);
    iVar3 = uv_fs_stat(0,alStack_600,"test_file_dst",0);
    if (iVar3 != 0) goto LAB_001876b9;
    if (lStack_558 == lVar2) {
      if (lStack_588 == lVar1) {
        uv_fs_req_cleanup(alStack_600);
        iVar3 = uv_fs_req_cleanup(plVar9);
        result_check_count = result_check_count + 1;
        return iVar3;
      }
      goto LAB_001876d7;
    }
  }
  else {
    handle_result_cold_1();
LAB_0018769b:
    handle_result_cold_2();
LAB_001876aa:
    handle_result_cold_3();
LAB_001876b9:
    handle_result_cold_4();
  }
  handle_result_cold_5();
LAB_001876d7:
  handle_result_cold_6();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
          ,0x2c,"fail_cb should not have been called");
  fflush(_stderr);
  abort();
}

Assistant:

TEST_IMPL(fs_copyfile) {
  const char src[] = "test_file_src";
  uv_loop_t* loop;
  uv_fs_t req;
  int r;

  loop = uv_default_loop();

  /* Fails with EINVAL if bad flags are passed. */
  r = uv_fs_copyfile(NULL, &req, src, dst, -1, NULL);
  ASSERT_EQ(r, UV_EINVAL);
  uv_fs_req_cleanup(&req);

  /* Fails with ENOENT if source does not exist. */
  unlink(src);
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT_EQ(req.result, UV_ENOENT);
  ASSERT_EQ(r, UV_ENOENT);
  uv_fs_req_cleanup(&req);
  /* The destination should not exist. */
  r = uv_fs_stat(NULL, &req, dst, NULL);
  ASSERT(r);
  uv_fs_req_cleanup(&req);

  /* Succeeds if src and dst files are identical. */
  touch_file(src, 12);
  r = uv_fs_copyfile(NULL, &req, src, src, 0, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&req);
  /* Verify that the src file did not get truncated. */
  r = uv_fs_stat(NULL, &req, src, NULL);
  ASSERT_OK(r);
  ASSERT_EQ(12, req.statbuf.st_size);
  uv_fs_req_cleanup(&req);
  unlink(src);

  /* Copies file synchronously. Creates new file. */
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, 0, NULL);
  ASSERT_OK(r);
  handle_result(&req);

  /* Copies a file of size zero. */
  unlink(dst);
  touch_file(src, 0);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT_OK(r);
  handle_result(&req);

  /* Copies file synchronously. Overwrites existing file. */
  r = uv_fs_copyfile(NULL, &req, fixture, dst, 0, NULL);
  ASSERT_OK(r);
  handle_result(&req);

  /* Fails to overwrites existing file. */
  ASSERT_OK(uv_fs_chmod(NULL, &req, dst, 0644, NULL));
  uv_fs_req_cleanup(&req);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, UV_FS_COPYFILE_EXCL, NULL);
  ASSERT_EQ(r, UV_EEXIST);
  uv_fs_req_cleanup(&req);

  /* Truncates when an existing destination is larger than the source file. */
  ASSERT_OK(uv_fs_chmod(NULL, &req, dst, 0644, NULL));
  uv_fs_req_cleanup(&req);
  touch_file(src, 1);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT_OK(r);
  handle_result(&req);

  /* Copies a larger file. */
  unlink(dst);
  touch_file(src, 4096 * 2);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT_OK(r);
  handle_result(&req);
  unlink(src);

  /* Copies file asynchronously */
  unlink(dst);
  r = uv_fs_copyfile(loop, &req, fixture, dst, 0, handle_result);
  ASSERT_OK(r);
  ASSERT_EQ(5, result_check_count);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_EQ(6, result_check_count);
  /* Ensure file is user-writable (not copied from src). */
  ASSERT_OK(uv_fs_chmod(NULL, &req, dst, 0644, NULL));
  uv_fs_req_cleanup(&req);

  /* If the flags are invalid, the loop should not be kept open */
  unlink(dst);
  r = uv_fs_copyfile(loop, &req, fixture, dst, -1, fail_cb);
  ASSERT_EQ(r, UV_EINVAL);
  uv_run(loop, UV_RUN_DEFAULT);

  /* Copies file using UV_FS_COPYFILE_FICLONE. */
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, UV_FS_COPYFILE_FICLONE, NULL);
  ASSERT_OK(r);
  handle_result(&req);

  /* Copies file using UV_FS_COPYFILE_FICLONE_FORCE. */
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, UV_FS_COPYFILE_FICLONE_FORCE,
                     NULL);
  ASSERT_LE(r, 0);

  if (r == 0)
    handle_result(&req);

#ifndef _WIN32
  /* Copying respects permissions/mode. */
  unlink(dst);
  touch_file(dst, 0);
  chmod(dst, S_IRUSR|S_IRGRP|S_IROTH); /* Sets file mode to 444 (read-only). */
  r = uv_fs_copyfile(NULL, &req, fixture, dst, 0, NULL);
  /* On IBMi PASE, qsecofr users can overwrite read-only files */
# ifndef __PASE__
  ASSERT_EQ(req.result, UV_EACCES);
  ASSERT_EQ(r, UV_EACCES);
# endif
  uv_fs_req_cleanup(&req);
#endif

  unlink(dst); /* Cleanup */
  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}